

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O3

void btokSMCtrInc(void *state)

{
  size_t pos;
  long lVar1;
  ulong uVar2;
  
  uVar2 = 1;
  lVar1 = 0;
  do {
    uVar2 = *(byte *)((long)state + lVar1 + 0x40) + uVar2;
    *(char *)((long)state + lVar1 + 0x40) = (char)uVar2;
    uVar2 = uVar2 >> 8;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

void btokSMCtrInc(void* state)
{
	btok_sm_st* st = (btok_sm_st*)state;
	register word carry = 1;
	size_t pos;
	// pre
	ASSERT(memIsValid(state, btokSM_keep()));
	// инкремент
	for (pos = 0; pos < 16; ++pos)
		carry += st->ctr[pos], st->ctr[pos] = (octet)carry, carry >>= 8;
	carry = 0;
}